

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::TextureQueryLodInstance::setupDefaultInputs(TextureQueryLodInstance *this)

{
  VkFormat format;
  VkFormat VVar1;
  float *dataPtr;
  VkFormat coordFormats [3];
  int texCoordComps;
  vector<float,_std::allocator<float>_> texCoord;
  deUint32 numVertices;
  TextureQueryLodInstance *this_local;
  
  TextureQueryInstance::setupDefaultInputs(&this->super_TextureQueryInstance);
  computeQuadTexCoord((vector<float,_std::allocator<float>_> *)(coordFormats + 2),this);
  VVar1 = getQueryLodFuncTextCoordComps(((this->super_TextureQueryInstance).m_textureSpec)->type);
  coordFormats[1] = VVar1;
  coordFormats[0] = VK_FORMAT_R32G32B32_SFLOAT;
  format = coordFormats[(long)(int)(VVar1 - VK_FORMAT_R4G4_UNORM_PACK8) + -2];
  dataPtr = std::vector<float,_std::allocator<float>_>::data
                      ((vector<float,_std::allocator<float>_> *)(coordFormats + 2));
  ShaderRenderCaseInstance::addAttribute
            ((ShaderRenderCaseInstance *)this,1,format,VVar1 << 2,4,dataPtr);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)(coordFormats + 2));
  return;
}

Assistant:

void TextureQueryLodInstance::setupDefaultInputs (void)
{
	TextureQueryInstance::setupDefaultInputs();

	const deUint32			numVertices			= 4;
	const vector<float>		texCoord			= computeQuadTexCoord();
	const int				texCoordComps		= getQueryLodFuncTextCoordComps(m_textureSpec.type);
	const vk::VkFormat		coordFormats[]		=
	{
		vk::VK_FORMAT_R32_SFLOAT,
		vk::VK_FORMAT_R32G32_SFLOAT,
		vk::VK_FORMAT_R32G32B32_SFLOAT
	};

	DE_ASSERT(de::inRange(texCoordComps, 1, 3));
	DE_ASSERT((int)texCoord.size() == texCoordComps * 4);

	addAttribute(1u, coordFormats[texCoordComps - 1], (deUint32)(texCoordComps * sizeof(float)), numVertices, texCoord.data());
}